

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

quint16 toWindowsIdKey(QByteArray *winId)

{
  quint16 *pqVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  storage_type *in_RCX;
  size_t __n;
  quint16 *pqVar5;
  difference_type __d;
  ulong uVar6;
  QByteArrayView winId_00;
  WindowsData entry;
  ulong uVar7;
  
  pqVar5 = &QtTimeZoneCldr::windowsDataTable;
  uVar7 = 0x8b;
  do {
    uVar6 = uVar7 >> 1;
    pqVar1 = pqVar5 + uVar6 * 6;
    winId_00.m_data = in_RCX;
    winId_00.m_size = (qsizetype)(winId->d).ptr;
    entry.offsetFromUtc = (qint32)(winId->d).size;
    entry.windowsIdKey = pqVar1[0];
    entry.windowsIdIndex = pqVar1[1];
    entry.ianaIdIndex = pqVar1[2];
    entry._6_2_ = pqVar1[3];
    bVar3 = earlierWindowsId(entry,winId_00);
    if (bVar3) {
      pqVar5 = pqVar5 + uVar6 * 6 + 6;
      uVar6 = ~uVar6 + uVar7;
    }
    uVar7 = uVar6;
  } while (0 < (long)uVar6);
  if (pqVar5 != (quint16 *)&DAT_00597174) {
    __n = 0xffffffffffffffff;
    do {
      lVar2 = __n + (ulong)pqVar5[1] + 1;
      __n = __n + 1;
    } while ("Afghanistan Standard Time"[lVar2] != '\0');
    if (((winId->d).size == __n) &&
       ((__n == 0 ||
        (iVar4 = bcmp("Afghanistan Standard Time" + pqVar5[1],(winId->d).ptr,__n), iVar4 == 0)))) {
      return *pqVar5;
    }
  }
  return 0;
}

Assistant:

static quint16 toWindowsIdKey(const QByteArray &winId)
{
    // Key and winId are monotonic, table is sorted on them.
    const auto data = std::lower_bound(std::begin(windowsDataTable), std::end(windowsDataTable),
                                       winId, earlierWindowsId);
    if (data != std::end(windowsDataTable) && data->windowsId() == winId)
        return data->windowsIdKey;
    return 0;
}